

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O3

ByteData256 * __thiscall
cfd::core::Transaction::GetSignatureHash
          (ByteData256 *__return_storage_ptr__,Transaction *this,uint32_t txin_index,
          ByteData *script_data,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  wally_tx *tx;
  pointer script;
  bool bVar1;
  uint uVar2;
  uint32_t sighash;
  uchar *bytes_out;
  uint64_t satoshi;
  CfdException *pCVar3;
  uint32_t flags;
  value_type_conflict *__val;
  int ret;
  undefined1 local_b8 [32];
  wally_tx *tx_pointer;
  uint32_t local_8c;
  ByteData256 *local_88;
  SigHashType *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_88 = __return_storage_ptr__;
  local_80 = sighash_type;
  bVar1 = ByteData::IsEmpty(script_data);
  if (bVar1) {
    local_b8._0_8_ = "cfdcore_transaction.cpp";
    local_b8._8_4_ = 0x2f2;
    local_b8._16_8_ = "GetSignatureHash";
    logger::log<>((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,"empty script");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b8._0_8_ = local_b8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Failed to GetSignatureHash. empty script.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_b8);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (version < kVersion1) {
    bytes_out = (uchar *)operator_new(0x20);
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = bytes_out + 0x20;
    bytes_out[0x10] = '\0';
    bytes_out[0x11] = '\0';
    bytes_out[0x12] = '\0';
    bytes_out[0x13] = '\0';
    bytes_out[0x14] = '\0';
    bytes_out[0x15] = '\0';
    bytes_out[0x16] = '\0';
    bytes_out[0x17] = '\0';
    bytes_out[0x18] = '\0';
    bytes_out[0x19] = '\0';
    bytes_out[0x1a] = '\0';
    bytes_out[0x1b] = '\0';
    bytes_out[0x1c] = '\0';
    bytes_out[0x1d] = '\0';
    bytes_out[0x1e] = '\0';
    bytes_out[0x1f] = '\0';
    bytes_out[0] = '\0';
    bytes_out[1] = '\0';
    bytes_out[2] = '\0';
    bytes_out[3] = '\0';
    bytes_out[4] = '\0';
    bytes_out[5] = '\0';
    bytes_out[6] = '\0';
    bytes_out[7] = '\0';
    bytes_out[8] = '\0';
    bytes_out[9] = '\0';
    bytes_out[10] = '\0';
    bytes_out[0xb] = '\0';
    bytes_out[0xc] = '\0';
    bytes_out[0xd] = '\0';
    bytes_out[0xe] = '\0';
    bytes_out[0xf] = '\0';
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = bytes_out;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ByteData::GetBytes(&local_48,script_data);
    tx_pointer = (wally_tx *)0x0;
    ret = 0;
    uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[7])(this);
    (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xd])
              (local_b8,this,(ulong)(uVar2 & 0xff));
    ByteData::GetBytes(&local_60,(ByteData *)local_b8);
    local_8c = txin_index;
    if ((pointer)local_b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._0_8_);
    }
    ret = wally_tx_from_bytes(local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_60.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_60.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,0,&tx_pointer);
    if (ret != 0) {
      local_b8._0_8_ = "cfdcore_transaction.cpp";
      local_b8._8_4_ = 0x307;
      local_b8._16_8_ = "GetSignatureHash";
      logger::log<int&>((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,
                        "wally_tx_from_bytes NG[{}] ",&ret);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_b8._0_8_ = local_b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"transaction data invalid.","");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_b8);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = -3;
    if (tx_pointer != (wally_tx *)0x0) {
      if (version == kVersionNone) {
        flags = 0;
      }
      else {
        uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])(this);
        flags = uVar2 & 1;
      }
      script = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      tx = tx_pointer;
      satoshi = Amount::GetSatoshiValue(value);
      sighash = SigHashType::GetSigHashFlag(local_80);
      ret = wally_tx_get_btc_signature_hash
                      (tx,(ulong)local_8c,script,
                       (long)local_48.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)script,satoshi,
                       sighash,flags,bytes_out,0x20);
      wally_tx_free(tx_pointer);
      if (ret == 0) {
        ByteData256::ByteData256(local_88,&local_78);
        if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        return local_88;
      }
    }
    local_b8._0_8_ = "cfdcore_transaction.cpp";
    local_b8._8_4_ = 800;
    local_b8._16_8_ = "GetSignatureHash";
    logger::log<int&>((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,
                      "wally_tx_get_btc_signature_hash NG[{}] ",&ret);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b8._0_8_ = local_b8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"SignatureHash generate error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_b8);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_b8._0_8_ = "cfdcore_transaction.cpp";
  local_b8._8_4_ = 0x2f7;
  local_b8._16_8_ = "GetSignatureHash";
  logger::log<>((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,
                "unsupport witness version on ECDSA.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_b8._0_8_ = local_b8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"unsupport witness version on ECDSA.","");
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_b8);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 Transaction::GetSignatureHash(
    uint32_t txin_index, const ByteData &script_data, SigHashType sighash_type,
    const Amount &value, WitnessVersion version) const {
  if (script_data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "empty script");
    throw CfdException(
        kCfdIllegalArgumentError, "Failed to GetSignatureHash. empty script.");
  }
  if (version >= WitnessVersion::kVersion1) {
    warn(CFD_LOG_SOURCE, "unsupport witness version on ECDSA.");
    throw CfdException(
        kCfdIllegalArgumentError, "unsupport witness version on ECDSA.");
  }
  std::vector<uint8_t> buffer(SHA256_LEN);
  const std::vector<uint8_t> &bytes = script_data.GetBytes();
  struct wally_tx *tx_pointer = NULL;
  int ret = WALLY_OK;

  // It is assumed that tx information has been created.
  // (If it is not created, it will cause inconsistency)
  const std::vector<uint8_t> &tx_bytedata =
      GetByteData(HasWitness()).GetBytes();
  ret = wally_tx_from_bytes(
      tx_bytedata.data(), tx_bytedata.size(), 0, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_bytes NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }

  ret = WALLY_ENOMEM;
  if (tx_pointer != NULL) {
    try {
      uint32_t tx_flag = 0;
      if (version != WitnessVersion::kVersionNone) {
        tx_flag = GetWallyFlag() & WALLY_TX_FLAG_USE_WITNESS;
      }
      ret = wally_tx_get_btc_signature_hash(
          tx_pointer, txin_index, bytes.data(), bytes.size(),
          value.GetSatoshiValue(), sighash_type.GetSigHashFlag(), tx_flag,
          buffer.data(), buffer.size());
      wally_tx_free(tx_pointer);
    } catch (...) {
      wally_tx_free(tx_pointer);  // Separately released in case of exception
                                  // (possibility of exception by warn ())
      warn(CFD_LOG_SOURCE, "wally_tx_get_btc_signature_hash cause exception.");
      ret = WALLY_ERROR;
    }
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_btc_signature_hash NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }

  return ByteData256(buffer);
}